

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *plVar1;
  Index *__name;
  const_reference pvVar2;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *plVar3;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *plVar4;
  
  plVar1 = (list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
            *)(this + 0x10);
  plVar3 = plVar1;
  while (plVar3 = *(list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
                    **)plVar3, plVar4 = plVar1, plVar3 != plVar1) {
    __name = *(Index **)(plVar3 + 0x10);
    Row_access<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
    ::unlink((Row_access<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
              *)this,(char *)__name);
    if (columnIndex != 0xffffffff) {
      *__name = columnIndex;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(valueMap,(ulong)__name[2])
    ;
    __name[2] = *pvVar2;
  }
  while (plVar4 = *(list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
                    **)plVar4, plVar4 != plVar1) {
    Row_access<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
    ::insert_entry((Row_access<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                    *)this,(*(Matrix_entry **)(plVar4 + 0x10))->rowIndex_,
                   *(Matrix_entry **)(plVar4 + 0x10));
  }
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  ::
  sort<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>const*)_1_>
            (plVar1);
  return;
}

Assistant:

inline void List_column<Master_matrix>::reorder(const Row_index_map& valueMap, [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  for (auto it = column_.begin(); it != column_.end(); ++it) {
    Entry* entry = *it;
    if constexpr (Master_matrix::Option_list::has_row_access) {
      RA_opt::unlink(entry);
      if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
    }
    entry->set_row_index(valueMap.at(entry->get_row_index()));
    if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
      RA_opt::insert_entry(entry->get_row_index(), entry);
  }

  // all entries have to be deleted first, to avoid problem with insertion when row is a set
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
    for (auto it = column_.begin(); it != column_.end(); ++it) {
      Entry* entry = *it;
      RA_opt::insert_entry(entry->get_row_index(), entry);
    }
  }

  column_.sort([](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
}